

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

Amount __thiscall cfd::TransactionContext::GetFeeAmount(TransactionContext *this)

{
  AbstractTxIn *pAVar1;
  AbstractTxOut *pAVar2;
  bool bVar3;
  uint32_t vout;
  int64_t iVar4;
  CfdException *this_00;
  undefined8 extraout_RDX;
  TxOut *txout_ref;
  AbstractTxIn *this_01;
  AbstractTxOut *this_02;
  Amount AVar5;
  Amount output;
  Amount input;
  UtxoData utxo;
  undefined1 local_588 [16];
  _func_int *local_578 [2];
  Amount local_568;
  OutPoint local_558;
  Amount local_530;
  UtxoData local_520;
  
  core::Amount::Amount(&local_530);
  UtxoData::UtxoData(&local_520);
  this_01 = &((this->super_Transaction).vin_.
              super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxIn;
  pAVar1 = &((this->super_Transaction).vin_.
             super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  if (this_01 != pAVar1) {
    do {
      core::AbstractTxIn::GetTxid((Txid *)local_588,this_01);
      vout = core::AbstractTxIn::GetVout(this_01);
      core::OutPoint::OutPoint(&local_558,(Txid *)local_588,vout);
      local_588._0_8_ = &PTR__Txid_00723450;
      if ((void *)CONCAT71(local_588._9_7_,local_588[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_588._9_7_,local_588[8]));
      }
      bVar3 = IsFindUtxoMap(this,&local_558,&local_520);
      if (!bVar3) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_588._0_8_ = local_578;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_588,"Utxo is not found. GetFeeAmount fail.","");
        core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_588);
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::Amount::operator+=(&local_530,&local_520.amount);
      local_558.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_558.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_558.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pAVar1);
  }
  core::Amount::Amount((Amount *)&local_558);
  this_02 = &((this->super_Transaction).vout_.
              super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxOut;
  pAVar2 = &((this->super_Transaction).vout_.
             super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_AbstractTxOut;
  if (this_02 != pAVar2) {
    do {
      AVar5 = core::AbstractTxOut::GetValue(this_02);
      local_588._0_8_ = AVar5.amount_;
      local_588[8] = AVar5.ignore_check_;
      core::Amount::operator+=((Amount *)&local_558,(Amount *)local_588);
      this_02 = this_02 + 1;
    } while (this_02 != pAVar2);
  }
  AVar5 = core::operator-(&local_530,(Amount *)&local_558);
  local_588._0_8_ = AVar5.amount_;
  local_588[8] = AVar5.ignore_check_;
  iVar4 = core::Amount::GetSatoshiValue((Amount *)local_588);
  if (iVar4 < 0) {
    core::Amount::Amount(&local_568);
  }
  else {
    local_568._9_7_ = local_588._9_7_;
    local_568.ignore_check_ = local_588[8];
    local_568.amount_ = local_588._0_8_;
  }
  UtxoData::~UtxoData(&local_520);
  AVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar5.ignore_check_ = local_568.ignore_check_;
  AVar5.amount_ = local_568.amount_;
  return AVar5;
}

Assistant:

Amount TransactionContext::GetFeeAmount() const {
  Amount input;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. GetFeeAmount fail.");
    }
    input += utxo.amount;
  }

  Amount output;
  for (const auto& txout_ref : vout_) {
    output += txout_ref.GetValue();
  }
  Amount result = input - output;
  if (result.GetSatoshiValue() < 0) {
    return Amount();
  }
  return result;
}